

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void __thiscall
cmCacheManager::WritePropertyEntries
          (cmCacheManager *this,ostream *os,string *entryKey,CacheEntry *e,cmMessenger *messenger)

{
  cmAlphaNum *this_00;
  bool bVar1;
  string *psVar2;
  cmAlphaNum local_190;
  cmAlphaNum local_160;
  undefined1 local_130 [8];
  string key;
  cmAlphaNum local_e0;
  undefined1 local_b0 [8];
  string helpstring;
  allocator<char> local_79;
  string local_78;
  cmValue local_58;
  cmValue value;
  char *p;
  char **__end1;
  char **__begin1;
  char *(*__range1) [3];
  cmMessenger *messenger_local;
  CacheEntry *e_local;
  string *entryKey_local;
  ostream *os_local;
  cmCacheManager *this_local;
  
  for (__end1 = PersistentProperties; __end1 != &PTR_typeinfo_01116c18; __end1 = __end1 + 1) {
    psVar2 = (string *)*__end1;
    value.Value = psVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,(char *)psVar2,&local_79)
    ;
    local_58 = CacheEntry::GetProperty(e,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    bVar1 = cmValue::operator_cast_to_bool(&local_58);
    if (bVar1) {
      cmAlphaNum::cmAlphaNum(&local_e0,(char *)value.Value);
      this_00 = (cmAlphaNum *)((long)&key.field_2 + 8);
      cmAlphaNum::cmAlphaNum(this_00," property for variable: ");
      cmStrCat<std::__cxx11::string>((string *)local_b0,&local_e0,this_00,entryKey);
      OutputHelpString(os,(string *)local_b0);
      cmAlphaNum::cmAlphaNum(&local_160,entryKey);
      cmAlphaNum::cmAlphaNum(&local_190,'-');
      cmStrCat<char_const*>((string *)local_130,&local_160,&local_190,(char **)&value);
      OutputKey(os,(string *)local_130);
      std::operator<<(os,":INTERNAL=");
      psVar2 = cmValue::operator*[abi_cxx11_(&local_58);
      OutputValue(os,psVar2);
      std::operator<<(os,'\n');
      psVar2 = cmValue::operator*[abi_cxx11_(&local_58);
      OutputNewlineTruncationWarning(os,(string *)local_130,psVar2,messenger);
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)local_b0);
    }
  }
  return;
}

Assistant:

void cmCacheManager::WritePropertyEntries(std::ostream& os,
                                          const std::string& entryKey,
                                          const CacheEntry& e,
                                          cmMessenger* messenger) const
{
  for (const char* p : cmCacheManager::PersistentProperties) {
    if (cmValue value = e.GetProperty(p)) {
      std::string helpstring =
        cmStrCat(p, " property for variable: ", entryKey);
      cmCacheManager::OutputHelpString(os, helpstring);

      std::string key = cmStrCat(entryKey, '-', p);
      cmCacheManager::OutputKey(os, key);
      os << ":INTERNAL=";
      cmCacheManager::OutputValue(os, *value);
      os << '\n';
      cmCacheManager::OutputNewlineTruncationWarning(os, key, *value,
                                                     messenger);
    }
  }
}